

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DWARFDebugPubTable.cpp
# Opt level: O2

void __thiscall llvm::DWARFDebugPubTable::dump(DWARFDebugPubTable *this,raw_ostream *OS)

{
  _func_int **pp_Var1;
  raw_ostream *prVar2;
  char *Str;
  Entry *E;
  pointer pEVar3;
  pointer pEVar4;
  pointer pSVar5;
  raw_ostream *this_00;
  StringRef SVar6;
  StringRef SVar7;
  format_object_base local_a8;
  char *local_98;
  pointer local_90;
  _func_int **local_88;
  pointer local_80;
  pointer local_78;
  _func_int **local_70;
  _func_int **local_68;
  _func_int **local_60;
  DWARFDebugPubTable *local_58;
  raw_ostream *local_50;
  format_object_base local_48;
  char *local_38;
  
  pSVar5 = (this->Sets).
           super__Vector_base<llvm::DWARFDebugPubTable::Set,_std::allocator<llvm::DWARFDebugPubTable::Set>_>
           ._M_impl.super__Vector_impl_data._M_start;
  local_78 = (this->Sets).
             super__Vector_base<llvm::DWARFDebugPubTable::Set,_std::allocator<llvm::DWARFDebugPubTable::Set>_>
             ._M_impl.super__Vector_impl_data._M_finish;
  local_70 = (_func_int **)&PTR_home_01127cd0;
  local_68 = (_func_int **)&PTR_home_01127df8;
  local_60 = (_func_int **)&PTR_home_01127cf0;
  local_88 = (_func_int **)&PTR_home_01128020;
  local_58 = this;
  local_50 = OS;
  while (this_00 = local_50, pSVar5 != local_78) {
    prVar2 = raw_ostream::operator<<(local_50,"length = ");
    pp_Var1 = local_70;
    local_48.Fmt = "0x%08x";
    local_48._vptr_format_object_base = local_70;
    local_38 = (char *)CONCAT44(local_38._4_4_,pSVar5->Length);
    raw_ostream::operator<<(prVar2,&local_48);
    prVar2 = raw_ostream::operator<<(this_00," version = ");
    local_48.Fmt = "0x%04x";
    local_48._vptr_format_object_base = local_68;
    local_38 = (char *)CONCAT62(local_38._2_6_,pSVar5->Version);
    raw_ostream::operator<<(prVar2,&local_48);
    prVar2 = raw_ostream::operator<<(this_00," unit_offset = ");
    local_48.Fmt = "0x%08lx";
    local_48._vptr_format_object_base = local_60;
    local_38 = (char *)pSVar5->Offset;
    raw_ostream::operator<<(prVar2,&local_48);
    prVar2 = raw_ostream::operator<<(this_00," unit_size = ");
    local_48.Fmt = "0x%08x";
    local_48._vptr_format_object_base = pp_Var1;
    local_38 = (char *)CONCAT44(local_38._4_4_,pSVar5->Size);
    prVar2 = raw_ostream::operator<<(prVar2,&local_48);
    raw_ostream::operator<<(prVar2,'\n');
    Str = "Offset     Name\n";
    if (local_58->GnuStyle != false) {
      Str = "Offset     Linkage  Kind     Name\n";
    }
    raw_ostream::operator<<(this_00,Str);
    pEVar4 = (pSVar5->Entries).
             super__Vector_base<llvm::DWARFDebugPubTable::Entry,_std::allocator<llvm::DWARFDebugPubTable::Entry>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    local_90 = pEVar4;
    local_80 = pSVar5;
    for (pEVar3 = (pSVar5->Entries).
                  super__Vector_base<llvm::DWARFDebugPubTable::Entry,_std::allocator<llvm::DWARFDebugPubTable::Entry>_>
                  ._M_impl.super__Vector_impl_data._M_start; pEVar3 != pEVar4; pEVar3 = pEVar3 + 1)
    {
      local_48.Fmt = "0x%8.8lx ";
      local_48._vptr_format_object_base = local_60;
      local_38 = (char *)pEVar3->SecOffset;
      raw_ostream::operator<<(this_00,&local_48);
      if (local_58->GnuStyle == true) {
        SVar6 = dwarf::GDBIndexEntryLinkageString((pEVar3->Descriptor).Linkage);
        SVar7 = dwarf::GDBIndexEntryKindString((pEVar3->Descriptor).Kind);
        this_00 = local_50;
        pp_Var1 = local_88;
        local_48.Fmt = "%-8s";
        local_48._vptr_format_object_base = local_88;
        local_38 = SVar6.Data;
        prVar2 = raw_ostream::operator<<(local_50,&local_48);
        prVar2 = raw_ostream::operator<<(prVar2,' ');
        pEVar4 = local_90;
        local_a8.Fmt = "%-8s";
        local_a8._vptr_format_object_base = pp_Var1;
        local_98 = SVar7.Data;
        prVar2 = raw_ostream::operator<<(prVar2,&local_a8);
        raw_ostream::operator<<(prVar2,' ');
      }
      prVar2 = raw_ostream::operator<<(this_00,'\"');
      prVar2 = raw_ostream::operator<<(prVar2,pEVar3->Name);
      raw_ostream::operator<<(prVar2,"\"\n");
    }
    pSVar5 = local_80 + 1;
  }
  return;
}

Assistant:

void DWARFDebugPubTable::dump(raw_ostream &OS) const {
  for (const Set &S : Sets) {
    OS << "length = " << format("0x%08x", S.Length);
    OS << " version = " << format("0x%04x", S.Version);
    OS << " unit_offset = " << format("0x%08" PRIx64, S.Offset);
    OS << " unit_size = " << format("0x%08x", S.Size) << '\n';
    OS << (GnuStyle ? "Offset     Linkage  Kind     Name\n"
                    : "Offset     Name\n");

    for (const Entry &E : S.Entries) {
      OS << format("0x%8.8" PRIx64 " ", E.SecOffset);
      if (GnuStyle) {
        StringRef EntryLinkage =
            GDBIndexEntryLinkageString(E.Descriptor.Linkage);
        StringRef EntryKind = dwarf::GDBIndexEntryKindString(E.Descriptor.Kind);
        OS << format("%-8s", EntryLinkage.data()) << ' '
           << format("%-8s", EntryKind.data()) << ' ';
      }
      OS << '\"' << E.Name << "\"\n";
    }
  }
}